

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O1

void ExpReplay::predict_or_learn<true,MULTICLASS::mc_label>
               (expreplay *er,single_learner *base,example *ec)

{
  polylabel *ppVar1;
  example *peVar2;
  label_t lVar3;
  wclass *pwVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20));
  ppVar1 = &ec->l;
  fVar8 = (float)(*(code *)PTR_weight_002dba38)(ppVar1);
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    if (1 < er->replay_count) {
      uVar7 = 1;
      do {
        fVar8 = merand48(&er->all->random_state);
        fVar8 = fVar8 * (float)er->N;
        uVar6 = (ulong)fVar8;
        uVar6 = (long)(fVar8 - 9.223372e+18) & (long)uVar6 >> 0x3f | uVar6;
        if (er->filled[uVar6] == true) {
          (**(code **)(base + 0x28))
                    (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),er->buf + uVar6);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < er->replay_count);
    }
    fVar8 = merand48(&er->all->random_state);
    fVar8 = fVar8 * (float)er->N;
    uVar7 = (ulong)fVar8;
    uVar7 = (long)(fVar8 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
    if (er->filled[uVar7] != false) {
      (**(code **)(base + 0x28))
                (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),er->buf + uVar7);
    }
    er->filled[uVar7] = true;
    VW::copy_example_data(er->all->audit,er->buf + uVar7,ec);
    peVar2 = er->buf;
    if (DAT_002dba40 != (code *)0x0) {
      (*DAT_002dba40)(&peVar2[uVar7].l,ppVar1);
      return;
    }
    peVar2[uVar7].l.cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
    lVar3 = ppVar1->multi;
    pwVar4 = (ec->l).cs.costs._end;
    sVar5 = (ec->l).cs.costs.erase_count;
    peVar2[uVar7].l.cs.costs.end_array = (ec->l).cs.costs.end_array;
    peVar2[uVar7].l.cs.costs.erase_count = sVar5;
    peVar2[uVar7].l.multi = lVar3;
    peVar2[uVar7].l.cs.costs._end = pwVar4;
  }
  return;
}

Assistant:

void predict_or_learn(expreplay& er, LEARNER::single_learner& base, example& ec)
{  // regardless of what happens, we must predict
  base.predict(ec);
  // if we're not learning, that's all that has to happen
  if (!is_learn || lp.get_weight(&ec.l) == 0.)
    return;

  for (size_t replay = 1; replay < er.replay_count; replay++)
  {
    size_t n = (size_t)(merand48(er.all->random_state) * (float)er.N);
    if (er.filled[n])
      base.learn(er.buf[n]);
  }

  size_t n = (size_t)(merand48(er.all->random_state) * (float)er.N);
  if (er.filled[n])
    base.learn(er.buf[n]);

  er.filled[n] = true;
  VW::copy_example_data(er.all->audit, &er.buf[n], &ec);  // don't copy the label
  if (lp.copy_label)
    lp.copy_label(&er.buf[n].l, &ec.l);
  else
    er.buf[n].l = ec.l;
}